

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

Image * vera::scale(Image *__return_storage_ptr__,Image *_image,int _width,int _height)

{
  double dVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  undefined4 extraout_var;
  size_t _index;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aVar5;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar6;
  vec<4,_float,_(glm::qualifier)0> vVar7;
  vec<4,_float,_(glm::qualifier)0> local_d8;
  vec<4,_float,_(glm::qualifier)0> local_c8;
  float local_b8;
  int local_b4;
  float pixel_weight;
  int src_pixel_index;
  int x_offset;
  int i;
  int y_offset;
  int k;
  vec4 sum;
  BicubicPrecalc *hPrecalc;
  int dstx;
  BicubicPrecalc *vPrecalc;
  int dsty;
  vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_> vPrecalcs;
  allocator<vera::BicubicPrecalc> local_41;
  undefined1 local_40 [8];
  vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_> hPrecalcs;
  int _height_local;
  int _width_local;
  Image *_image_local;
  Image *out;
  
  hPrecalcs.super__Vector_base<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  iVar2 = (*_image->_vptr_Image[8])();
  Image::Image(__return_storage_ptr__,_width,_height,iVar2);
  std::allocator<vera::BicubicPrecalc>::allocator(&local_41);
  std::vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>::vector
            ((vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_> *)local_40,
             (long)_width,&local_41);
  std::allocator<vera::BicubicPrecalc>::~allocator(&local_41);
  std::allocator<vera::BicubicPrecalc>::allocator
            ((allocator<vera::BicubicPrecalc> *)((long)&vPrecalc + 7));
  std::vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>::vector
            ((vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_> *)&dsty,
             (long)_height,(allocator<vera::BicubicPrecalc> *)((long)&vPrecalc + 7));
  std::allocator<vera::BicubicPrecalc>::~allocator
            ((allocator<vera::BicubicPrecalc> *)((long)&vPrecalc + 7));
  iVar2 = (*_image->_vptr_Image[6])();
  ResampleBicubicPrecalc
            ((vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_> *)local_40,iVar2);
  iVar2 = (*_image->_vptr_Image[7])();
  ResampleBicubicPrecalc
            ((vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_> *)&dsty,iVar2);
  for (vPrecalc._0_4_ = 0; (int)vPrecalc < _height; vPrecalc._0_4_ = (int)vPrecalc + 1) {
    pvVar4 = std::vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>::operator[]
                       ((vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_> *)&dsty
                        ,(long)(int)vPrecalc);
    for (hPrecalc._4_4_ = 0; hPrecalc._4_4_ < _width; hPrecalc._4_4_ = hPrecalc._4_4_ + 1) {
      sum._8_8_ = std::vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>::
                  operator[]((vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_> *)
                             local_40,(long)hPrecalc._4_4_);
      glm::vec<4,_float,_(glm::qualifier)0>::vec((vec<4,_float,_(glm::qualifier)0> *)&y_offset,0.0);
      for (i = -1; i < 3; i = i + 1) {
        x_offset = pvVar4->offset[i + 1];
        for (src_pixel_index = -1; iVar2 = x_offset, src_pixel_index < 3;
            src_pixel_index = src_pixel_index + 1) {
          pixel_weight = *(float *)(sum._8_8_ + 0x24 + (long)src_pixel_index * 4);
          iVar3 = (*_image->_vptr_Image[6])();
          local_b4 = iVar2 * iVar3 + (int)pixel_weight;
          dVar1 = *(double *)(sum._8_8_ + 8 + (long)src_pixel_index * 8);
          aVar5 = SUB84(dVar1,0);
          aVar6 = SUB84((ulong)dVar1 >> 0x20,0);
          local_b8 = (float)(pvVar4->weight[(long)i + 1] * dVar1);
          iVar2 = (*_image->_vptr_Image[0xe])(_image,(long)(int)pixel_weight,(long)x_offset);
          (*_image->_vptr_Image[0x19])(_image,CONCAT44(extraout_var,iVar2));
          local_d8.field_3 = aVar6;
          local_d8.field_2 = aVar5;
          vVar7 = glm::operator*(&local_d8,local_b8);
          local_c8._8_8_ = vVar7._8_8_;
          local_c8._0_8_ = vVar7._0_8_;
          glm::vec<4,float,(glm::qualifier)0>::operator+=
                    ((vec<4,float,(glm::qualifier)0> *)&y_offset,&local_c8);
        }
      }
      _index = Image::getIndex(__return_storage_ptr__,(long)hPrecalc._4_4_,(long)(int)vPrecalc);
      Image::setColor(__return_storage_ptr__,_index,(vec4 *)&y_offset);
    }
  }
  hPrecalcs.super__Vector_base<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>::~vector
            ((vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_> *)&dsty);
  std::vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>::~vector
            ((vector<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_> *)local_40);
  if ((hPrecalcs.super__Vector_base<vera::BicubicPrecalc,_std::allocator<vera::BicubicPrecalc>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    Image::~Image(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Image scale(const Image& _image, int _width, int _height) {
    Image out = Image(_width, _height, _image.getChannels());

     // Precalculate weights
    std::vector<BicubicPrecalc> hPrecalcs(_width);
    std::vector<BicubicPrecalc> vPrecalcs(_height);

    ResampleBicubicPrecalc(hPrecalcs, _image.getWidth());
    ResampleBicubicPrecalc(vPrecalcs, _image.getHeight());

    for (int dsty = 0; dsty < _height; dsty++ ) {
        // We need to calculate the source pixel to interpolate from - Y-axis
        const BicubicPrecalc& vPrecalc = vPrecalcs[dsty];

        for (int dstx = 0; dstx < _width; dstx++ ) {
            // X-axis of pixel to interpolate from
            const BicubicPrecalc& hPrecalc = hPrecalcs[dstx];

            // Sums for each color channel
            glm::vec4 sum = glm::vec4(0.0f);

            // Here we actually determine the RGBA values for the destination pixel
            for ( int k = -1; k <= 2; k++ ) {
                // Y offset
                const int y_offset = vPrecalc.offset[k + 1];

                // Loop across the X axis
                for ( int i = -1; i <= 2; i++ ) {
                    // X offset
                    const int x_offset = hPrecalc.offset[i + 1];

                    // Calculate the exact position where the source data
                    // should be pulled from based on the x_offset and y_offset
                    int src_pixel_index = y_offset * _image.getWidth() + x_offset;

                    // Calculate the weight for the specified pixel according
                    // to the bicubic b-spline kernel we're using for
                    // interpolation
                    const float pixel_weight = vPrecalc.weight[k + 1] * hPrecalc.weight[i + 1];
                    sum += _image.getColor( _image.getIndex(x_offset, y_offset) ) * pixel_weight;
                }
            }
            out.setColor(out.getIndex(dstx, dsty), sum);
        }
    }
    return out;
}